

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::ShapeAtomType_*>::~SimpleTypeData
          (SimpleTypeData<OpenMD::ShapeAtomType_*> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::ShapeAtomType_*> *)0x2d0a78);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}